

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::InvalidSizeTest::createInstance
          (InvalidSizeTest *this,Context *context)

{
  InvalidSizeTestInstance *this_00;
  Context *context_local;
  InvalidSizeTest *this_local;
  
  this_00 = (InvalidSizeTestInstance *)operator_new(0x580);
  InvalidSizeTestInstance::InvalidSizeTestInstance
            (this_00,context,&(this->super_GraphicsCacheTest).super_CacheTest.m_param);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* InvalidSizeTest::createInstance (Context& context) const
{
	return new InvalidSizeTestInstance(context, &m_param);
}